

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int planandnavigate2d(PlannerType plannerType,char *envCfgFilename)

{
  uint uVar1;
  uint uVar2;
  ADPlanner *pAVar3;
  ulong uVar4;
  FILE *pFVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  anaPlanner *this;
  clock_t cVar9;
  SBPL_Exception *pSVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  undefined8 uVar15;
  uchar obsthresh;
  int starty;
  int startx;
  double local_590;
  int newy;
  int goaly;
  int goalx;
  int size_y;
  int size_x;
  uint local_570;
  uint local_56c;
  uint local_568;
  uint local_564;
  ADPlanner *local_560;
  ulong local_558;
  FILE *local_550;
  void *local_548;
  sbpl_2Dcell_t nav2dcell;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  MDPConfig MDPCfg;
  int newx;
  EnvironmentNAV2D environment_nav2D;
  EnvironmentNAV2D trueenvironment_nav2D;
  
  EnvironmentNAV2D::EnvironmentNAV2D(&environment_nav2D);
  EnvironmentNAV2D::EnvironmentNAV2D(&trueenvironment_nav2D);
  size_x = -1;
  size_y = -1;
  startx = 0;
  starty = 0;
  goalx = -1;
  goaly = -1;
  local_550 = fopen("sol.txt","w");
  if (local_550 == (FILE *)0x0) {
    pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: could not open solution file");
    __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nav2dcell.x = 0;
  nav2dcell.y = 0;
  srand(0);
  cVar6 = EnvironmentNAV2D::SetEnvParameter((char *)&trueenvironment_nav2D,0x10c4b3);
  if (cVar6 == '\0') {
    pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: failed to set parameters");
  }
  else {
    cVar6 = EnvironmentNAV2D::SetEnvParameter((char *)&environment_nav2D,0x10c4b3);
    if (cVar6 == '\0') {
      pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: failed to set parameters");
    }
    else {
      cVar6 = EnvironmentNAV2D::InitializeEnv((char *)&trueenvironment_nav2D);
      if (cVar6 != '\0') {
        EnvironmentNAV2D::GetEnvParms
                  ((int *)&trueenvironment_nav2D,&size_x,&size_y,&startx,&starty,&goalx,
                   (uchar *)&goaly);
        iVar14 = size_x;
        iVar7 = size_y;
        local_548 = calloc((long)(size_y * size_x),1);
        cVar6 = EnvironmentNAV2D::InitializeEnv
                          ((int)&environment_nav2D,iVar14,(uchar *)(ulong)(uint)iVar7,(int)local_548
                           ,startx,starty,goalx,(uchar)goaly);
        if (cVar6 == '\0') {
          pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: InitializeEnv failed");
        }
        else {
          cVar6 = EnvironmentNAV2D::InitializeMDPCfg((MDPConfig *)&environment_nav2D);
          if (cVar6 != '\0') {
            solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            switch(plannerType) {
            case PLANNER_TYPE_ADSTAR:
              puts("Initializing ADPlanner...");
              this = (anaPlanner *)operator_new(0x98);
              ADPlanner::ADPlanner
                        ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_nav2D,false);
              break;
            case PLANNER_TYPE_ARASTAR:
              puts("Initializing ARAPlanner...");
              this = (anaPlanner *)operator_new(0xa0);
              ARAPlanner::ARAPlanner
                        ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_nav2D,false);
              break;
            default:
              puts("Invalid planner type");
              this = (anaPlanner *)0x0;
              break;
            case PLANNER_TYPE_RSTAR:
              puts("Initializing RSTARPlanner...");
              this = (anaPlanner *)operator_new(0x68);
              RSTARPlanner::RSTARPlanner
                        ((RSTARPlanner *)this,(DiscreteSpaceInformation *)&environment_nav2D,false);
              break;
            case PLANNER_TYPE_ANASTAR:
              puts("Initializing anaPlanner...");
              this = (anaPlanner *)operator_new(0x48);
              anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)&environment_nav2D,false);
            }
            (**(code **)(*(long *)this + 0x90))(0x4000000000000000,this);
            iVar7 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
            if (iVar7 == 0) {
              puts("ERROR: failed to set start state");
              pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: failed to set start state");
            }
            else {
              iVar7 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
              if (iVar7 != 0) {
                (**(code **)(*(long *)this + 0x40))(this,0);
                local_558 = 0;
                local_570 = 0;
                local_56c = 0;
                local_568 = 0;
                local_564 = 0;
                local_560 = (ADPlanner *)this;
                while( true ) {
                  uVar4 = local_558;
                  uVar2 = local_564;
                  uVar1 = local_568;
                  uVar11 = local_56c;
                  uVar13 = local_570;
                  if ((startx == goalx) && (starty == goaly)) {
                    printf("stats: plantimes over 1 secs=%d; over 0.5 secs=%d; over 0.1 secs=%d; over 0.05 secs=%d; below 0.05 secs=%d\n"
                           ,(ulong)local_564,(ulong)local_568,(ulong)local_56c,(ulong)local_570,
                           local_558 & 0xffffffff);
                    pFVar5 = local_550;
                    fprintf(local_550,
                            "stats: plantimes over 1 secs=%d; over 0.5; secs=%d; over 0.1 secs=%d; over 0.05 secs=%d; below 0.05 secs=%d\n"
                            ,(ulong)uVar2,(ulong)uVar1,(ulong)uVar11,(ulong)uVar13,uVar4);
                    fflush((FILE *)0x0);
                    fclose(pFVar5);
                    (**(code **)(*(long *)local_560 + 0xa0))();
                    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                              (&solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>);
                    std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
                              (&changedcellsV.
                                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>);
                    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                              (&preds_of_changededgesIDV.
                                super__Vector_base<int,_std::allocator<int>_>);
                    EnvironmentNAV2D::~EnvironmentNAV2D(&trueenvironment_nav2D);
                    EnvironmentNAV2D::~EnvironmentNAV2D(&environment_nav2D);
                    return 1;
                  }
                  if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish !=
                      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start) {
                    preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                  }
                  if (changedcellsV.
                      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      changedcellsV.
                      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         changedcellsV.
                         super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                         super__Vector_impl_data._M_start;
                  }
                  local_590 = (double)((ulong)local_590 & 0xffffffff00000000);
                  for (iVar7 = -2; iVar7 != 3; iVar7 = iVar7 + 1) {
                    for (iVar14 = -2; iVar8 = size_x, iVar14 != 3; iVar14 = iVar14 + 1) {
                      uVar13 = startx + iVar7;
                      if ((((-1 < (int)uVar13) && ((int)uVar13 < size_x)) &&
                          (uVar11 = starty + iVar14, -1 < (int)uVar11)) && ((int)uVar11 < size_y)) {
                        cVar6 = EnvironmentNAV2D::GetMapCost((int)&trueenvironment_nav2D,uVar13);
                        lVar12 = (ulong)uVar13 + (ulong)(iVar8 * uVar11);
                        if (*(char *)((long)local_548 + lVar12) != cVar6) {
                          *(char *)((long)local_548 + lVar12) = cVar6;
                          EnvironmentNAV2D::UpdateCost((int)&environment_nav2D,uVar13,(uchar)uVar11)
                          ;
                          iVar8 = printf("setting cost[%d][%d] to %d\n",(ulong)uVar13,(ulong)uVar11)
                          ;
                          nav2dcell.y = uVar11;
                          nav2dcell.x = uVar13;
                          local_590 = (double)CONCAT44(local_590._4_4_,
                                                       (int)CONCAT71((uint7)(uint3)((uint)iVar8 >> 8
                                                                                   ),1));
                          std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::push_back
                                    (&changedcellsV,&nav2dcell);
                        }
                      }
                    }
                  }
                  cVar9 = clock();
                  pAVar3 = local_560;
                  if (((ulong)local_590 & 1) != 0) {
                    lVar12 = __dynamic_cast(local_560,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo,0
                                           );
                    if (lVar12 == 0) {
                      lVar12 = __dynamic_cast(pAVar3,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo,0);
                      if (lVar12 != 0) {
                        EnvironmentNAV2D::GetPredsofChangedEdges
                                  ((vector *)&environment_nav2D,(vector *)&changedcellsV);
                        (**(code **)(*(long *)pAVar3 + 0xb0))(pAVar3,&preds_of_changededgesIDV);
                      }
                    }
                    else {
                      (**(code **)(*(long *)pAVar3 + 0xa8))(pAVar3);
                    }
                  }
                  fprintf(local_550,"%d %d ",(ulong)(uint)startx,(ulong)(uint)starty);
                  puts("new planning...");
                  iVar7 = (*(code *)**(undefined8 **)pAVar3)
                                    (0x3fc999999999999a,pAVar3,&solution_stateIDs_V);
                  printf("done with the solution of size=%d\n",
                         (ulong)((long)solution_stateIDs_V.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)solution_stateIDs_V.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
                  EnvironmentNAV2D::PrintTimeStat((_IO_FILE *)&environment_nav2D);
                  if (iVar7 != 1) break;
                  local_590 = (double)cVar9;
                  cVar9 = clock();
                  local_590 = ((double)cVar9 - local_590) / 1000000.0;
                  uVar15 = (**(code **)(*(long *)pAVar3 + 0x50))(pAVar3);
                  pFVar5 = local_550;
                  fprintf(local_550,"%.5f %.5f\n",local_590,uVar15);
                  fflush(pFVar5);
                  if (local_590 <= 1.0) {
                    if (local_590 <= 0.5) {
                      if (local_590 <= 0.1) {
                        if (local_590 <= 0.05) {
                          local_558 = (ulong)((int)local_558 + 1);
                        }
                        else {
                          local_570 = local_570 + 1;
                        }
                      }
                      else {
                        local_56c = local_56c + 1;
                      }
                    }
                    else {
                      local_568 = local_568 + 1;
                    }
                  }
                  else {
                    local_564 = local_564 + 1;
                  }
                  if (1 < (int)((ulong)((long)solution_stateIDs_V.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)solution_stateIDs_V.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2)) {
                    EnvironmentNAV2D::GetCoordFromState
                              ((int)&environment_nav2D,
                               (int *)(ulong)(uint)solution_stateIDs_V.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[1],&newx
                              );
                    EnvironmentNAV2D::GetMapCost((int)&trueenvironment_nav2D,newx);
                    pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                    SBPL_Exception::SBPL_Exception
                              (pSVar10,"ERROR: robot is commanded to move into an obstacle");
                    __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error
                               );
                  }
                }
                pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&newx,"SBPL has encountered a fatal error!",
                           (allocator<char> *)&newy);
                SBPL_Exception::SBPL_Exception(pSVar10,(string *)&newx);
                __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
              }
              puts("ERROR: failed to set goal state");
              pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: failed to set goal state");
            }
            __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: InitializeMDPCfg failed");
        }
        __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar10 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(pSVar10,"ERROR: InitializeEnv failed");
    }
  }
  __cxa_throw(pSVar10,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planandnavigate2d(PlannerType plannerType, char* envCfgFilename)
{
    double allocated_time_secs_foreachplan = 0.2; //in seconds
    MDPConfig MDPCfg;
    EnvironmentNAV2D environment_nav2D;
    EnvironmentNAV2D trueenvironment_nav2D;
    int size_x = -1, size_y = -1;
    int startx = 0, starty = 0;
    int goalx = -1, goaly = -1;
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    //int dx[8] = {-1, -1, -1,  0,  0,  1,  1,  1};
    //int dy[8] = {-1,  0,  1, -1,  1, -1,  0,  1};
    bool bPrint = false;
    int x, y;
    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    unsigned char obsthresh = 0;
    srand(0);
    int plantime_over1secs = 0, plantime_over0p5secs = 0, plantime_over0p1secs = 0, plantime_over0p05secs = 0,
        plantime_below0p05secs = 0;

    //set parameters - should be done before initialization
    if (!trueenvironment_nav2D.SetEnvParameter("is16connected", 1)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_nav2D.SetEnvParameter("is16connected", 1)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    //initialize true map and robot map
    if (!trueenvironment_nav2D.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }
    trueenvironment_nav2D.GetEnvParms(&size_x, &size_y, &startx, &starty, &goalx, &goaly, &obsthresh);
    unsigned char* map = (unsigned char*)calloc(size_x * size_y, sizeof(unsigned char));

    //print the map
    if (bPrint) printf("true map:\n");
    for (y = 0; bPrint && y < size_y; y++) {
        for (x = 0; x < size_x; x++) {
            printf("%d ", (int)trueenvironment_nav2D.IsObstacle(x, y));
        }
        printf("\n");
    }
    if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

    //Initialize Environment (should be called before initializing anything else)
    if (!environment_nav2D.InitializeEnv(size_x, size_y, map, startx, starty, goalx, goaly, obsthresh)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_nav2D.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //create a planner
    vector<int> solution_stateIDs_V;
    bool bforwardsearch = false;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_nav2D, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    planner->set_initialsolution_eps(2.0);

    //set the start and goal configurations
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    //set search mode
    planner->set_search_mode(false);

    //now comes the main loop
    int goalthresh = 0;
    while (abs(startx - goalx) > goalthresh || abs(starty - goaly) > goalthresh) {

        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        int dX = 0;
        int dY = 0;
        for (dX = -2; dX <= 2; dX++) {
            for (dY = -2; dY <= 2; dY++) {
                int x = startx + dX;
                int y = starty + dY;
                if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                    continue;
                }
                int index = x + y * size_x;
                unsigned char truecost = trueenvironment_nav2D.GetMapCost(x, y);
                if (map[index] != truecost) {
                    map[index] = truecost;
                    environment_nav2D.UpdateCost(x, y, map[index]);
                    printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                    bChanges = true;
                    // store the changed cells
                    nav2dcell.x = x;
                    nav2dcell.y = y;
                    changedcellsV.push_back(nav2dcell);
                }
            }
        }

        double TimeStarted = clock();

        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                //get the affected states
                environment_nav2D.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                //let know the incremental planner about them
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
            }
        }
        //planner.force_planning_from_scratch();

        fprintf(fSol, "%d %d ", startx, starty);

        //plan a path
        bool bPlanExists = false;
        while (bPlanExists == false) {
            printf("new planning...\n");
            bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
            printf("done with the solution of size=%d\n", (unsigned int)solution_stateIDs_V.size());
            environment_nav2D.PrintTimeStat(stdout);
            if (bPlanExists == false) {
                throw SBPL_Exception();
            }

            //for(unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
            //environment_nav2D.PrintState(solution_stateIDs_V[i], true, fSol);
            //}
            //fprintf(fSol, "*********\n");
        }

        double plantime_secs = (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC);
        fprintf(fSol, "%.5f %.5f\n", plantime_secs, planner->get_solution_eps());
        fflush(fSol);
        if (plantime_secs > 1.0)
            plantime_over1secs++;
        else if (plantime_secs > 0.5)
            plantime_over0p5secs++;
        else if (plantime_secs > 0.1)
            plantime_over0p1secs++;
        else if (plantime_secs > 0.05)
            plantime_over0p05secs++;
        else
            plantime_below0p05secs++;

        //print the map
        int startindex = startx + starty * size_x;
        int goalindex = goalx + goaly * size_x;
        for (y = 0; bPrint && y < size_y; y++) {
            for (x = 0; x < size_x; x++) {
                int index = x + y * size_x;

                //check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy;
                    environment_nav2D.GetCoordFromState(solution_stateIDs_V[j], newx, newy);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath)
                    printf("%3d ", map[index]);
                else if (index == startindex)
                    printf("  R ");
                else if (index == goalindex)
                    printf("  G ");
                else if (bOnthePath)
                    printf("  * ");
                else
                    printf("  ? ");
            }
            printf("\n");
        }
        if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

        //move along the path
        if (bPlanExists && (int)solution_stateIDs_V.size() > 1) {
            //get coord of the successor
            int newx, newy;
            environment_nav2D.GetCoordFromState(solution_stateIDs_V[1], newx, newy);

            if (trueenvironment_nav2D.GetMapCost(newx, newy) >= obsthresh) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an obstacle");
            }

            //move
            printf("moving from %d %d to %d %d\n", startx, starty, newx, newy);
            startx = newx;
            starty = newy;

            //update the environment
            environment_nav2D.SetStart(startx, starty);

            //update the planner
            if (planner->set_start(solution_stateIDs_V[1]) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }

    }

    //print stats
    printf("stats: plantimes over 1 secs=%d; over 0.5 secs=%d; over 0.1 secs=%d; "
           "over 0.05 secs=%d; below 0.05 secs=%d\n",
           plantime_over1secs, plantime_over0p5secs, plantime_over0p1secs, plantime_over0p05secs,
           plantime_below0p05secs);
    fprintf(fSol, "stats: plantimes over 1 secs=%d; over 0.5; secs=%d; over 0.1 secs=%d; "
            "over 0.05 secs=%d; below 0.05 secs=%d\n",
            plantime_over1secs, plantime_over0p5secs, plantime_over0p1secs, plantime_over0p05secs,
            plantime_below0p05secs);

    if (bPrint) printf("System Pause (return=%d)\n", system("pause"));

    fflush(NULL);
    fclose(fSol);

    delete planner;

    return 1;
}